

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetFontOffsetForIndex(uchar *data,int index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = stbtt__isfont(data);
  if (iVar1 == 0) {
    uVar2 = 0xffffffff;
    if ((((*data == 't') && (data[1] == 't')) && (data[2] == 'c')) && (data[3] == 'f')) {
      uVar3 = *(uint *)(data + 4);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (((uVar3 == 0x20000) || (uVar3 == 0x10000)) &&
         (uVar3 = *(uint *)(data + 8),
         index < (int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18))) {
        uVar2 = *(uint *)(data + (long)index * 4 + 0xc);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
  }
  else {
    uVar2 = -(uint)(index != 0);
  }
  return uVar2;
}

Assistant:

STBTT_DEF int stbtt_GetFontOffsetForIndex(const unsigned char *data, int index)
{
   return stbtt_GetFontOffsetForIndex_internal((unsigned char *) data, index);   
}